

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O2

int gost2015_acpkm_omac_init
              (int nid,int enc,uchar *inkey,EVP_MD_CTX *omac_ctx,uchar *outkey,uchar *kdf_seed)

{
  int iVar1;
  int iVar2;
  char *name;
  EVP_MD *type;
  EVP_PKEY *pkey;
  uchar keys [64];
  
  name = OBJ_nid2sn(nid);
  type = EVP_get_digestbyname(name);
  iVar1 = 0;
  if (type != (EVP_MD *)0x0) {
    if ((enc != 0) && (iVar1 = RAND_bytes(kdf_seed,8), iVar1 != 1)) {
      return 0;
    }
    iVar2 = gost_kdftree2012_256(keys,0x40,inkey,0x20,(uchar *)"kdf tree",8,kdf_seed,8,1);
    iVar1 = 0;
    if (0 < iVar2) {
      iVar1 = 0;
      pkey = EVP_PKEY_new_mac_key(nid,(ENGINE *)0x0,keys + 0x20,0x20);
      if (pkey != (EVP_PKEY *)0x0) {
        iVar1 = 0;
        iVar2 = EVP_DigestInit_ex((EVP_MD_CTX *)omac_ctx,type,(ENGINE *)0x0);
        if (0 < iVar2) {
          iVar1 = 0;
          iVar2 = EVP_DigestSignInit((EVP_MD_CTX *)omac_ctx,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,
                                     pkey);
          if (0 < iVar2) {
            *(undefined8 *)(outkey + 0x10) = keys._16_8_;
            *(undefined8 *)(outkey + 0x18) = keys._24_8_;
            *(undefined8 *)outkey = keys._0_8_;
            *(undefined8 *)(outkey + 8) = keys._8_8_;
            iVar1 = 1;
          }
        }
      }
      EVP_PKEY_free(pkey);
      OPENSSL_cleanse(keys,0x40);
    }
  }
  return iVar1;
}

Assistant:

int gost2015_acpkm_omac_init(int nid, int enc, const unsigned char *inkey,
                             EVP_MD_CTX *omac_ctx,
                             unsigned char *outkey, unsigned char *kdf_seed)
{
    int ret = 0;
    unsigned char keys[64];
    const EVP_MD *md = EVP_get_digestbynid(nid);
    EVP_PKEY *mac_key;

    if (md == NULL)
        return 0;

    if (enc) {
        if (RAND_bytes(kdf_seed, 8) != 1)
            return 0;
    }

    if (gost_kdftree2012_256(keys, 64, inkey, 32,
       (const unsigned char *)"kdf tree", 8, kdf_seed, 8, 1) <= 0)
        return 0;

    mac_key = EVP_PKEY_new_mac_key(nid, NULL, keys+32, 32);

    if (mac_key == NULL)
        goto end;

    if (EVP_DigestInit_ex(omac_ctx, md, NULL) <= 0 ||
       EVP_DigestSignInit(omac_ctx, NULL, md, NULL, mac_key) <= 0)
        goto end;

    memcpy(outkey, keys, 32);

    ret = 1;
end:
    EVP_PKEY_free(mac_key);
    OPENSSL_cleanse(keys, sizeof(keys));

    return ret;
}